

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  size_t local_58;
  size_t outl;
  size_t l;
  uint8_t *re;
  uint8_t *rb;
  zip_conflict *zip;
  archive_write *paStack_28;
  int ret;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  rb = (uint8_t *)a->format_data;
  paStack_28 = (archive_write *)s;
  if (*(long *)(rb + 0x28) < (long)s) {
    paStack_28 = *(archive_write **)(rb + 0x28);
  }
  *(long *)(rb + 0x20) = (long)&(paStack_28->archive).magic + *(long *)(rb + 0x20);
  if (paStack_28 == (archive_write *)0x0) {
    a_local = (archive_write *)0x0;
  }
  else {
    s_local = (size_t)buff;
    buff_local = a;
    if ((*(uint *)(rb + 0x44) & 1) != 0) {
      if (*(int *)(rb + 0x40) == 1) {
        if (rb[0x5c] == '\0') {
          iVar2 = init_traditional_pkware_encryption(a);
          if (iVar2 != 0) {
            return (long)iVar2;
          }
          rb[0x5c] = '\x01';
          zip._4_4_ = 0;
        }
      }
      else if ((*(int *)(rb + 0x40) - 2U < 2) && (rb[0xc0] == '\0')) {
        iVar2 = init_winzip_aes_encryption(a);
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        rb[0xd0] = '\x01';
        rb[0xc0] = '\x01';
        zip._4_4_ = 0;
      }
    }
    if (*(int *)(rb + 0x3c) == 0) {
      if ((rb[0x5c] == '\0') && (rb[0xc0] == '\0')) {
        iVar2 = __archive_write_output
                          ((archive_write *)buff_local,(void *)s_local,(size_t)paStack_28);
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        *(long *)(rb + 0x110) = (long)&(paStack_28->archive).magic + *(long *)(rb + 0x110);
        *(long *)(rb + 0x18) = (long)&(paStack_28->archive).magic + *(long *)(rb + 0x18);
        zip._4_4_ = 0;
      }
      else {
        l = (long)&(paStack_28->archive).magic + s_local;
        for (re = (uint8_t *)s_local; re < l; re = re + outl) {
          if (rb[0x5c] == '\0') {
            outl = *(size_t *)(rb + 0x1b0);
            zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x68),re,l - (long)re,
                                       *(uint8_t **)(rb + 0x1b8),&outl);
            if (zip._4_4_ < 0) {
              archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 200),*(uint8_t **)(rb + 0x1b8),outl);
          }
          else {
            uVar1 = trad_enc_encrypt_update
                              ((trad_enc_ctx *)(rb + 0x50),re,l - (long)re,*(uint8_t **)(rb + 0x1b8)
                               ,*(size_t *)(rb + 0x1b0));
            outl = (size_t)uVar1;
          }
          iVar2 = __archive_write_output((archive_write *)buff_local,*(void **)(rb + 0x1b8),outl);
          if (iVar2 != 0) {
            return (long)iVar2;
          }
          *(size_t *)(rb + 0x18) = outl + *(long *)(rb + 0x18);
          *(size_t *)(rb + 0x110) = outl + *(long *)(rb + 0x110);
          zip._4_4_ = 0;
        }
      }
    }
    else {
      if (*(int *)(rb + 0x3c) != 8) {
        archive_set_error((archive *)buff_local,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      *(size_t *)(rb + 0x140) = s_local;
      *(int *)(rb + 0x148) = (int)paStack_28;
      do {
        zip._4_4_ = cm_zlib_deflate((z_streamp)(rb + 0x140),0);
        if (zip._4_4_ == -2) {
          return -0x1e;
        }
        if (*(int *)(rb + 0x160) == 0) {
          if (rb[0x5c] == '\0') {
            if (rb[0xc0] != '\0') {
              local_58 = *(size_t *)(rb + 0x1b0);
              zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x68),*(uint8_t **)(rb + 0x1b8)
                                         ,*(size_t *)(rb + 0x1b0),*(uint8_t **)(rb + 0x1b8),
                                         &local_58);
              if (zip._4_4_ < 0) {
                archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
                return -0x19;
              }
              __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 200),*(uint8_t **)(rb + 0x1b8),
                                 *(size_t *)(rb + 0x1b0));
            }
          }
          else {
            trad_enc_encrypt_update
                      ((trad_enc_ctx *)(rb + 0x50),*(uint8_t **)(rb + 0x1b8),*(size_t *)(rb + 0x1b0)
                       ,*(uint8_t **)(rb + 0x1b8),*(size_t *)(rb + 0x1b0));
          }
          iVar2 = __archive_write_output
                            ((archive_write *)buff_local,*(void **)(rb + 0x1b8),
                             *(size_t *)(rb + 0x1b0));
          if (iVar2 != 0) {
            return (long)iVar2;
          }
          *(long *)(rb + 0x18) = *(long *)(rb + 0x1b0) + *(long *)(rb + 0x18);
          *(long *)(rb + 0x110) = *(long *)(rb + 0x1b0) + *(long *)(rb + 0x110);
          *(undefined8 *)(rb + 0x158) = *(undefined8 *)(rb + 0x1b8);
          *(int *)(rb + 0x160) = (int)*(undefined8 *)(rb + 0x1b0);
          zip._4_4_ = 0;
        }
      } while (*(int *)(rb + 0x148) != 0);
    }
    *(long *)(rb + 0x28) = *(long *)(rb + 0x28) - (long)paStack_28;
    if ((rb[0xc0] == '\0') || (*(int *)(rb + 0x60) != 2)) {
      uVar3 = (**(code **)(rb + 0xe8))
                        (*(undefined4 *)(rb + 0x38),s_local,(ulong)paStack_28 & 0xffffffff);
      *(undefined4 *)(rb + 0x38) = uVar3;
    }
    a_local = paStack_28;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}